

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_disk_io.cpp
# Opt level: O1

void __thiscall libtorrent::mmap_disk_io::update_stats_counters(mmap_disk_io *this,counters *c)

{
  int iVar1;
  unique_lock<std::mutex> jl;
  unique_lock<std::mutex> local_38;
  unique_lock<std::mutex> local_28;
  
  local_38._M_device = &this->m_job_mutex;
  local_38._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  counters::set_value(c,0xf6,(long)(this->m_job_pool).m_read_jobs);
  counters::set_value(c,0xf7,(long)(this->m_job_pool).m_write_jobs);
  counters::set_value(c,0xf8,(long)(this->m_job_pool).m_jobs_in_use);
  counters::set_value(c,0xf4,(long)(this->m_hash_threads).m_queued_jobs.m_size +
                             (long)(this->m_generic_threads).m_queued_jobs.m_size);
  ::std::unique_lock<std::mutex>::unlock(&local_38);
  local_28._M_device = &(this->m_buffer_pool).m_pool_mutex;
  local_28._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  iVar1 = (this->m_buffer_pool).m_in_use;
  ::std::unique_lock<std::mutex>::~unique_lock(&local_28);
  counters::set_value(c,0xf3,(long)iVar1);
  ::std::unique_lock<std::mutex>::~unique_lock(&local_38);
  return;
}

Assistant:

void mmap_disk_io::update_stats_counters(counters& c) const
	{
		// These are atomic_counts, so it's safe to access them from
		// a different thread
		std::unique_lock<std::mutex> jl(m_job_mutex);

		c.set_value(counters::num_read_jobs, m_job_pool.read_jobs_in_use());
		c.set_value(counters::num_write_jobs, m_job_pool.write_jobs_in_use());
		c.set_value(counters::num_jobs, m_job_pool.jobs_in_use());
		c.set_value(counters::queued_disk_jobs, m_generic_threads.queue_size()
			+ m_hash_threads.queue_size());

		jl.unlock();

		// gauges
		c.set_value(counters::disk_blocks_in_use, m_buffer_pool.in_use());
	}